

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.c
# Opt level: O2

int scan_buffer(d_loc_t *aloc,D_State *parse_state,ShiftResult *results)

{
  char **ppcVar1;
  uchar uVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  ushort uVar6;
  void *pvVar7;
  void *pvVar8;
  char *pcVar9;
  char *pcVar10;
  SNode *pSVar11;
  D_Shift *pDVar12;
  char *pcVar13;
  undefined8 uVar14;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int *piVar21;
  d_loc_t *pdVar22;
  ShiftResult *pSVar23;
  long *plVar24;
  D_Shift **ppDVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  byte bVar34;
  byte *pbVar35;
  int local_84;
  ulong local_80;
  byte *local_78;
  char *local_48;
  char *pcStack_40;
  
  pbVar35 = (byte *)aloc->s;
  pcVar9 = aloc->pathname;
  pcVar10 = aloc->ws;
  local_84 = aloc->col;
  iVar31 = aloc->line;
  local_48 = aloc->pathname;
  pcStack_40 = aloc->ws;
  uVar2 = parse_state->scanner_size;
  local_78 = pbVar35;
  local_80._0_4_ = local_84;
  if (uVar2 == '\x04') {
    pvVar7 = parse_state->scanner_table;
    pvVar8 = parse_state->transition_table;
    uVar20 = 0;
    uVar16 = 0;
    uVar18 = 0;
    iVar29 = local_84;
    iVar27 = local_84;
    iVar30 = iVar31;
    local_84 = iVar31;
    while( true ) {
      iVar32 = iVar31;
      iVar28 = iVar29;
      bVar5 = *pbVar35;
      iVar31 = *(int *)(*(long *)((long)pvVar7 + (ulong)(bVar5 >> 6) * 8 + uVar18 * 0x28 + 8) +
                       (ulong)(bVar5 & 0x3f) * 4);
      if (iVar31 == 0) break;
      if ((uVar18 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) {
        piVar21 = &results[(int)uVar20].loc.line;
        for (ppDVar25 = parse_state->accepts_diff
                        [*(uint *)(*(long *)((long)pvVar8 + (ulong)(bVar5 >> 6) * 8 + uVar18 * 0x20)
                                  + (ulong)(bVar5 & 0x3f) * 4)]; *ppDVar25 != (D_Shift *)0x0;
            ppDVar25 = ppDVar25 + 1) {
          ((d_loc_t *)(piVar21 + -7))->s = (char *)pbVar35;
          *(char **)(piVar21 + -5) = pcVar9;
          *(char **)(piVar21 + -3) = pcVar10;
          piVar21[-1] = iVar27;
          *piVar21 = iVar30;
          *(D_Shift **)(piVar21 + -9) = *ppDVar25;
          uVar20 = uVar20 + 1;
          piVar21 = piVar21 + 0xc;
        }
      }
      pbVar35 = pbVar35 + 1;
      uVar33 = iVar31 - 1;
      uVar18 = (ulong)uVar33;
      if (*(long *)((long)pvVar7 + uVar18 * 0x28) != 0) {
        uVar16 = uVar33;
        local_84 = iVar32;
        local_78 = pbVar35;
        local_48 = pcVar9;
        pcStack_40 = pcVar10;
        local_80._0_4_ = iVar28;
      }
      iVar29 = iVar28 + 1;
      if (bVar5 == 10) {
        iVar29 = 0;
      }
      iVar31 = (uint)(bVar5 == 10) + iVar32;
      iVar27 = iVar28;
      iVar30 = iVar32;
    }
    plVar24 = (long *)((long)pvVar7 + (ulong)uVar16 * 0x28);
  }
  else if (uVar2 == '\x02') {
    pvVar7 = parse_state->scanner_table;
    pvVar8 = parse_state->transition_table;
    uVar20 = 0;
    local_80 = 0;
    uVar18 = 0;
    iVar27 = local_84;
    iVar30 = iVar31;
    iVar32 = iVar31;
    iVar29 = local_84;
    while( true ) {
      iVar28 = iVar30;
      iVar26 = iVar27;
      bVar5 = *pbVar35;
      uVar18 = uVar18 & 0xffff;
      uVar6 = *(ushort *)
               (*(long *)((long)pvVar7 + (ulong)(bVar5 >> 6) * 8 + uVar18 * 0x28 + 8) +
               (ulong)(bVar5 & 0x3f) * 2);
      if (uVar6 == 0) break;
      if ((uVar18 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) {
        piVar21 = &results[(int)uVar20].loc.line;
        for (ppDVar25 = parse_state->accepts_diff
                        [*(ushort *)
                          (*(long *)((long)pvVar8 +
                                    (ulong)(bVar5 >> 6) * 8 + (ulong)(uint)((int)uVar18 << 5)) +
                          (ulong)(bVar5 & 0x3f) * 2)]; *ppDVar25 != (D_Shift *)0x0;
            ppDVar25 = ppDVar25 + 1) {
          ((d_loc_t *)(piVar21 + -7))->s = (char *)pbVar35;
          *(char **)(piVar21 + -5) = pcVar9;
          *(char **)(piVar21 + -3) = pcVar10;
          piVar21[-1] = iVar29;
          *piVar21 = iVar32;
          *(D_Shift **)(piVar21 + -9) = *ppDVar25;
          uVar20 = uVar20 + 1;
          piVar21 = piVar21 + 0xc;
        }
      }
      pbVar35 = pbVar35 + 1;
      uVar16 = uVar6 - 1;
      uVar18 = (ulong)uVar16;
      if (*(long *)((long)pvVar7 + (uVar18 & 0xffff) * 0x28) != 0) {
        local_80 = (ulong)uVar16;
        iVar31 = iVar28;
        local_84 = iVar26;
        local_78 = pbVar35;
        local_48 = pcVar9;
        pcStack_40 = pcVar10;
      }
      iVar27 = iVar26 + 1;
      if (bVar5 == 10) {
        iVar27 = 0;
      }
      iVar30 = (uint)(bVar5 == 10) + iVar28;
      iVar32 = iVar28;
      iVar29 = iVar26;
    }
    plVar24 = (long *)((long)pvVar7 + (local_80 & 0xffff) * 0x28);
    local_80._0_4_ = local_84;
    local_84 = iVar31;
  }
  else {
    if (uVar2 != '\x01') {
      return 0;
    }
    pvVar7 = parse_state->scanner_table;
    pvVar8 = parse_state->transition_table;
    uVar20 = 0;
    uVar18 = 0;
    iVar29 = iVar31;
    bVar5 = 0;
    while( true ) {
      bVar3 = *pbVar35;
      cVar4 = *(char *)(*(long *)((long)pvVar7 + (ulong)(bVar3 >> 6) * 8 + uVar18 * 0x28 + 8) +
                       (ulong)(bVar3 & 0x3f));
      if (cVar4 == '\0') break;
      if ((uVar18 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) {
        piVar21 = &results[(int)uVar20].loc.line;
        for (ppDVar25 = parse_state->accepts_diff
                        [*(byte *)(*(long *)((long)pvVar8 +
                                            (ulong)(bVar3 >> 6) * 8 +
                                            (ulong)(uint)((int)uVar18 << 5)) + (ulong)(bVar3 & 0x3f)
                                  )]; *ppDVar25 != (D_Shift *)0x0; ppDVar25 = ppDVar25 + 1) {
          ((d_loc_t *)(piVar21 + -7))->s = (char *)pbVar35;
          *(char **)(piVar21 + -5) = pcVar9;
          *(char **)(piVar21 + -3) = pcVar10;
          piVar21[-1] = local_84;
          *piVar21 = iVar31;
          *(D_Shift **)(piVar21 + -9) = *ppDVar25;
          uVar20 = uVar20 + 1;
          piVar21 = piVar21 + 0xc;
        }
      }
      pbVar35 = pbVar35 + 1;
      bVar34 = cVar4 - 1;
      uVar18 = (ulong)bVar34;
      local_84 = local_84 + 1;
      if (bVar3 == 10) {
        local_84 = 0;
      }
      iVar31 = iVar31 + (uint)(bVar3 == 10);
      if (*(long *)((long)pvVar7 + (ulong)bVar34 * 0x28) != 0) {
        local_78 = pbVar35;
        local_80._0_4_ = local_84;
        iVar29 = iVar31;
        local_48 = pcVar9;
        pcStack_40 = pcVar10;
        bVar5 = bVar34;
      }
    }
    plVar24 = (long *)((long)pvVar7 + (ulong)bVar5 * 0x28);
    local_84 = iVar29;
  }
  plVar24 = (long *)*plVar24;
  if (plVar24 != (long *)0x0) {
    piVar21 = &results[(int)uVar20].loc.line;
    for (; *plVar24 != 0; plVar24 = plVar24 + 1) {
      ((d_loc_t *)(piVar21 + -7))->s = (char *)local_78;
      *(char **)(piVar21 + -5) = local_48;
      *(char **)(piVar21 + -3) = pcStack_40;
      piVar21[-1] = (int)local_80;
      *piVar21 = local_84;
      *(long *)(piVar21 + -9) = *plVar24;
      uVar20 = uVar20 + 1;
      piVar21 = piVar21 + 0xc;
    }
  }
  if (uVar20 == 0) {
    return 0;
  }
  uVar16 = uVar20 - 1;
  uVar18 = (ulong)uVar16;
  pcVar9 = results[(int)uVar16].loc.s;
  if (parse_state->scan_kind != '\x01') {
    if (parse_state->scan_kind != '\x02') {
      return uVar20;
    }
    uVar19 = 0xffffffff;
    if ((int)uVar16 < -1) {
      uVar19 = uVar18;
    }
    bVar15 = false;
    while ((uVar17 = uVar19, -1 < (int)uVar18 && (uVar17 = uVar18, pcVar9 <= results[uVar18].loc.s))
          ) {
      if ((results[uVar18].shift)->shift_kind == '\x01') {
        bVar15 = true;
      }
      uVar18 = (ulong)((int)uVar18 - 1);
    }
    uVar18 = uVar17;
    if (!bVar15) {
      while( true ) {
        uVar33 = (uint)uVar18;
        uVar16 = (uint)uVar17;
        if ((int)uVar16 < 0) break;
        if ((results[uVar17].shift)->shift_kind != '\x01') {
          if (uVar16 != uVar33) {
            pSVar23 = results + uVar17;
            pSVar11 = pSVar23->snode;
            pDVar12 = pSVar23->shift;
            pcVar9 = (pSVar23->loc).s;
            pcVar10 = (pSVar23->loc).pathname;
            uVar14 = *(undefined8 *)&(pSVar23->loc).col;
            ppcVar1 = &results[(int)uVar33].loc.ws;
            *ppcVar1 = (pSVar23->loc).ws;
            ppcVar1[1] = (char *)uVar14;
            results[(int)uVar33].loc.s = pcVar9;
            results[(int)uVar33].loc.pathname = pcVar10;
            results[(int)uVar33].snode = pSVar11;
            results[(int)uVar33].shift = pDVar12;
          }
          uVar18 = (ulong)(uVar33 - 1);
        }
        uVar17 = (ulong)(uVar16 - 1);
      }
      iVar31 = uVar20 + ~uVar33;
      if (uVar33 == 0xffffffff) {
        return iVar31;
      }
      memmove(results,results + (long)(int)uVar33 + 1,(long)iVar31 * 0x30);
      return iVar31;
    }
  }
  uVar19 = 0;
  uVar18 = (ulong)uVar20;
  if ((int)uVar20 < 1) {
    uVar18 = uVar19;
  }
  pdVar22 = &results->loc;
  uVar16 = 0;
  for (; uVar18 != uVar19; uVar19 = uVar19 + 1) {
    if ((pdVar22->s == pcVar9) || (*(char *)(*(long *)((long)(pdVar22 + -1) + 0x18) + 2) == '\x03'))
    {
      if (uVar19 != uVar16) {
        pSVar11 = *(SNode **)((long)(pdVar22 + -1) + 0x10);
        pDVar12 = *(D_Shift **)((long)(pdVar22 + -1) + 0x18);
        pcVar10 = pdVar22->s;
        pcVar13 = pdVar22->pathname;
        uVar14 = *(undefined8 *)&pdVar22->col;
        ppcVar1 = &results[(int)uVar16].loc.ws;
        *ppcVar1 = pdVar22->ws;
        ppcVar1[1] = (char *)uVar14;
        results[(int)uVar16].loc.s = pcVar10;
        results[(int)uVar16].loc.pathname = pcVar13;
        results[(int)uVar16].snode = pSVar11;
        results[(int)uVar16].shift = pDVar12;
      }
      uVar16 = uVar16 + 1;
    }
    pdVar22 = (d_loc_t *)((long)(pdVar22 + 1) + 0x10);
  }
  return uVar16;
}

Assistant:

int scan_buffer(d_loc_t *aloc, D_State *parse_state, ShiftResult *results) {
  d_loc_t loc = *aloc, last_loc = *aloc;
  char *s = loc.s;
  int col = loc.col, line = loc.line;
  int nresults = 0, i = 0, j;
  D_Shift **shift = NULL, **shift_diff = 0;

  switch (parse_state->scanner_size) {
    case 1: {
      /* all matches */
      SB_uint8 *st = (SB_uint8 *)parse_state->scanner_table;
      SB_trans_uint8 *tst = (SB_trans_uint8 *)parse_state->transition_table;
      uint8 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 2: {
      /* all matches */
      SB_uint16 *st = (SB_uint16 *)parse_state->scanner_table;
      SB_trans_uint16 *tst = (SB_trans_uint16 *)parse_state->transition_table;
      uint16 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 4: {
      /* all matches */
      SB_uint32 *st = (SB_uint32 *)parse_state->scanner_table;
      SB_trans_uint32 *tst = (SB_trans_uint32 *)parse_state->transition_table;
      uint32 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
  }
  if (shift) {
    for (; *shift; shift++) {
      results[nresults].loc = last_loc;
      results[nresults++].shift = *shift;
    }
  }
  if (nresults) {
    int longest = 0;
    char *end = results[nresults - 1].loc.s;
    if (parse_state->scan_kind == D_SCAN_LONGEST) longest = 1;
    if (parse_state->scan_kind == D_SCAN_MIXED) {
      for (i = nresults - 1; i >= 0; i--) {
        if (results[i].loc.s < end) break;
        if (results[i].shift->shift_kind == D_SCAN_LONGEST) longest = 1;
      }
    }
    if (longest) {
      /* keep only 'longest' */
      i = 0;
      for (j = 0; j < nresults; j++) {
        if (results[j].loc.s == end || results[j].shift->shift_kind == D_SCAN_TRAILING) {
          if (i != j) results[i] = results[j];
          i++;
        }
      }
      nresults = i;
    } else if (parse_state->scan_kind == D_SCAN_MIXED) {
      /* only keep non-longest */
      for (j = i; j >= 0; j--)
        if (results[j].shift->shift_kind != D_SCAN_LONGEST) {
          if (i != j) results[i] = results[j];
          i--;
        }
      nresults = nresults - i - 1;
      if (i != -1) memmove(&results[0], &results[i + 1], nresults * sizeof(results[0]));
    }
  }
  return nresults;
}